

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall TCMallocTest_NAllocX_Test::TestBody(TCMallocTest_NAllocX_Test *this)

{
  bool bVar1;
  TestingPortal *pTVar2;
  ulong uVar3;
  char *pcVar4;
  long *plVar5;
  AssertHelper local_88;
  Message local_80;
  unsigned_long local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  void *ptr;
  AssertHelper local_50;
  Message local_48 [3];
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  size_t rounded;
  size_t size;
  TCMallocTest_NAllocX_Test *this_local;
  
  size = (size_t)this;
  pTVar2 = tcmalloc::TestingPortal::Get();
  uVar3 = (**(code **)(*(long *)pTVar2 + 8))();
  if ((uVar3 & 1) == 0) {
    for (rounded = 0; rounded < 0x100001; rounded = GrowNallocxTestSize(rounded)) {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )nallocx(rounded,0);
      testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                ((internal *)local_30,"rounded","size",(unsigned_long *)&gtest_ar.message_,&rounded)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
      if (!bVar1) {
        testing::Message::Message(local_48);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x4b7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_50,local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::Message::~Message(local_48);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
      if (!bVar1) {
        return;
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )malloc(rounded);
      plVar5 = (long *)MallocExtension::instance();
      local_78 = (**(code **)(*plVar5 + 0xb0))
                           (plVar5,gtest_ar_1.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_70,"rounded","MallocExtension::instance()->GetAllocatedSize(ptr)"
                 ,(unsigned_long *)&gtest_ar.message_,&local_78);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
      if (!bVar1) {
        testing::Message::Message(&local_80);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x4b9,pcVar4);
        testing::internal::AssertHelper::operator=(&local_88,&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        testing::Message::~Message(&local_80);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
      if (!bVar1) {
        return;
      }
      free((void *)gtest_ar_1.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
  }
  return;
}

Assistant:

TEST(TCMallocTest, NAllocX) {
  if (TestingPortal::Get()->IsDebuggingMalloc()) {
    return;
  }

  for (size_t size = 0; size <= (1 << 20); size = GrowNallocxTestSize(size)) {
    size_t rounded = nallocx(size, 0);
    ASSERT_GE(rounded, size);
    void* ptr = malloc(size);
    ASSERT_EQ(rounded, MallocExtension::instance()->GetAllocatedSize(ptr));
    free(ptr);
  }
}